

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O2

_Bool range_iterator(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  char *pcVar1;
  long lVar2;
  gravity_fiber_t *fiber;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar3;
  gravity_class_t *pgVar4;
  gravity_value_t value;
  gravity_value_t value_00;
  char _buffer [4096];
  char local_1028 [4104];
  
  aVar3 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)((args->field_1).p)->objclass;
  pcVar1 = ((args->field_1).p)->identifier;
  if (aVar3.n <= (long)pcVar1) {
    lVar2 = args[1].field_1.n;
    pgVar4 = gravity_class_int;
    if (gravity_class_null == args[1].isa && lVar2 == 0) goto LAB_0012597c;
    if (args[1].isa != gravity_class_int) {
      builtin_strncpy(local_1028,"Iterator expects a numeric value here.",0x27);
      fiber = gravity_vm_fiber(vm);
      gravity_fiber_seterror(fiber,local_1028);
      value_00.field_1.n = 0;
      value_00.isa = gravity_class_null;
      gravity_vm_setslot(vm,value_00,rindex);
      return false;
    }
    if ((long)aVar3 < (long)pcVar1) {
      if (lVar2 < (long)pcVar1) {
        aVar3.p = (gravity_object_t *)(lVar2 + 1);
        goto LAB_0012597c;
      }
    }
    else if ((long)pcVar1 < lVar2) {
      aVar3.p = (gravity_object_t *)(lVar2 + -1);
      goto LAB_0012597c;
    }
  }
  aVar3.n = 0;
  pgVar4 = gravity_class_bool;
LAB_0012597c:
  value.field_1.n = aVar3.n;
  value.isa = pgVar4;
  gravity_vm_setslot(vm,value,rindex);
  return true;
}

Assistant:

static bool range_iterator (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)
    gravity_range_t *range = VALUE_AS_RANGE(GET_VALUE(0));

    // check for invalid range first
    if (range->to < range->from) RETURN_VALUE(VALUE_FROM_FALSE, rindex);

    // check for start of iteration
    if (VALUE_ISA_NULL(GET_VALUE(1))) RETURN_VALUE(VALUE_FROM_INT(range->from), rindex);

    // extract value
    gravity_value_t value = GET_VALUE(1);

    // check error condition
    if (!VALUE_ISA_INT(value)) RETURN_ERROR("Iterator expects a numeric value here.");

    // compute new value
    gravity_int_t n = value.n;
    if (range->from < range->to) {
        ++n;
        if (n > range->to) RETURN_VALUE(VALUE_FROM_FALSE, rindex);
    } else {
        --n;
        if (n < range->to) RETURN_VALUE(VALUE_FROM_FALSE, rindex);
    }

    // return new iterator
    RETURN_VALUE(VALUE_FROM_INT(n), rindex);
}